

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_add_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  mbedtls_mpi *X_00;
  mbedtls_mpi_sint in_RDX;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi B;
  mbedtls_mpi *in_stack_ffffffffffffffc8;
  
  X_00 = (mbedtls_mpi *)mpi_sint_abs(in_RDX);
  iVar1 = mbedtls_mpi_add_mpi(X_00,in_stack_ffffffffffffffc8,(mbedtls_mpi *)0x273c0dd);
  return iVar1;
}

Assistant:

int mbedtls_mpi_add_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_sint b)
{
    mbedtls_mpi B;
    mbedtls_mpi_uint p[1];

    p[0] = mpi_sint_abs(b);
    B.s = TO_SIGN(b);
    B.n = 1;
    B.p = p;

    return mbedtls_mpi_add_mpi(X, A, &B);
}